

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O3

llama_sampler *
llama_sampler_init_dry
          (llama_vocab *vocab,int32_t context_size,float dry_multiplier,float dry_base,
          int32_t dry_allowed_length,int32_t dry_penalty_last_n,char **seq_breakers,
          size_t num_breakers)

{
  char *__s;
  void *__s2;
  pointer piVar1;
  uint32_t uVar2;
  long lVar3;
  _Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false> _Var4;
  int32_t *piVar5;
  llama_sampler *plVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  _Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false> it;
  pointer __s1;
  size_t __n;
  size_t sVar10;
  bool bVar11;
  initializer_list<int> __l;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>_>
  pVar12;
  vector<int,_std::allocator<int>_> tokenization;
  string sequence_break;
  string word;
  unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  processed_breakers;
  key_type local_130;
  allocator_type local_129;
  int32_t local_128;
  int32_t local_124;
  llama_vocab *local_120;
  string local_118;
  vector<int,_std::allocator<int>_> local_f8;
  long *local_e0;
  ulong local_d8;
  long local_d0 [2];
  ulong local_c0;
  ulong local_b8;
  int32_t local_b0;
  float local_ac;
  float local_a8;
  int32_t local_a4;
  size_t local_a0;
  char **local_98;
  string local_90;
  size_t local_70;
  _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  local_68;
  
  local_128 = 0;
  if (0 < dry_penalty_last_n) {
    local_128 = dry_penalty_last_n;
  }
  if (dry_penalty_last_n == -1) {
    local_128 = context_size;
  }
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_124 = dry_penalty_last_n;
  local_120 = vocab;
  local_b0 = context_size;
  local_ac = dry_multiplier;
  local_a8 = dry_base;
  local_a4 = dry_allowed_length;
  local_a0 = num_breakers;
  local_98 = seq_breakers;
  if (((((dry_multiplier != 0.0) || (bVar11 = false, NAN(dry_multiplier))) &&
       (bVar11 = false, 1.0 <= dry_base)) &&
      ((bVar11 = dry_penalty_last_n != 0, bVar11 && (seq_breakers != (char **)0x0)))) &&
     (num_breakers != 0)) {
    sVar10 = 0;
    do {
      __s = local_98[sVar10];
      if ((__s == (char *)0x0) || (*__s == '\0')) {
        llama_log_internal(GGML_LOG_LEVEL_WARN,
                           "skipping null or empty DRY sequence breaker at index %zu\n",sVar10);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,__s,(allocator<char> *)&local_90);
        if (local_d8 == 0) {
          llama_log_internal(GGML_LOG_LEVEL_WARN,"skipping empty DRY sequence breaker\n");
        }
        else {
          if (0x28 < local_d8) {
            llama_log_internal(GGML_LOG_LEVEL_WARN,
                               "truncating DRY sequence breaker to %d characters\n",0x28);
            std::__cxx11::string::resize((ulong)&local_e0,'(');
          }
          local_130 = 0;
          uVar2 = llama_vocab::n_tokens(local_120);
          if (0 < (int)uVar2) {
            do {
              local_70 = sVar10;
              local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start._0_4_ = local_130;
              __l._M_len = 1;
              __l._M_array = (iterator)&local_f8;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_118,__l,&local_129);
              llama_vocab::detokenize_abi_cxx11_
                        (&local_90,local_120,(vector<int,_std::allocator<int>_> *)&local_118,true);
              if (local_118._M_dataplus._M_p != (pointer)0x0) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity -
                                (long)local_118._M_dataplus._M_p);
              }
              lVar3 = std::__cxx11::string::find((char *)&local_90,(ulong)local_e0,0);
              uVar9 = local_90._M_string_length;
              if (lVar3 == -1) {
                local_b8 = local_d8;
                lVar3 = std::__cxx11::string::find
                                  ((char)&local_90,(ulong)(uint)(int)(char)*local_e0);
                if (lVar3 != -1) {
                  local_c0 = uVar9;
                  do {
                    uVar7 = 1;
                    if (1 < local_b8) {
                      do {
                        if (uVar9 <= lVar3 + uVar7) break;
                        if (*(char *)(CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                               local_90._M_dataplus._M_p._0_4_) + lVar3 + uVar7) !=
                            *(char *)((long)local_e0 + uVar7)) goto LAB_0020a8d8;
                        uVar7 = uVar7 + 1;
                      } while (local_b8 != uVar7);
                    }
                    std::__cxx11::string::substr((ulong)&local_118,(ulong)&local_e0);
                    llama_vocab::tokenize(&local_f8,local_120,&local_118,false,false);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118._M_dataplus._M_p != &local_118.field_2) {
                      operator_delete(local_118._M_dataplus._M_p,
                                      local_118.field_2._M_allocated_capacity + 1);
                    }
                    if (0x50 < (ulong)((long)local_f8.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                      CONCAT44(local_f8.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._4_4_,
                                               (int)local_f8.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start))) {
                      std::vector<int,_std::allocator<int>_>::resize
                                ((vector<int,_std::allocator<int>_> *)&local_f8,0x14);
                    }
                    pVar12 = std::
                             _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                             ::equal_range(&local_68,&local_130);
                    piVar1 = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish;
                    _Var4._M_cur = (__node_type *)
                                   pVar12.first.
                                   super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                   ._M_cur;
                    if ((_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                         )_Var4._M_cur !=
                        pVar12.second.
                        super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                        ._M_cur.
                        super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                       ) {
                      __s1 = (pointer)CONCAT44(local_f8.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._4_4_,
                                               (int)local_f8.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start);
                      __n = (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)__s1;
                      do {
                        __s2 = *(void **)((long)&((_Var4._M_cur)->
                                                 super__Hash_node_value<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                                 ).
                                                 super__Hash_node_value_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                                 ._M_storage._M_storage + 8);
                        if ((__n == *(long *)((long)&((_Var4._M_cur)->
                                                                                                          
                                                  super__Hash_node_value<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_storage._M_storage + 0x10) - (long)__s2) &&
                           ((piVar1 == __s1 || (iVar8 = bcmp(__s1,__s2,__n), iVar8 == 0))))
                        goto LAB_0020a8b1;
                        _Var4._M_cur = (__node_type *)((_Var4._M_cur)->super__Hash_node_base)._M_nxt
                        ;
                      } while ((_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                )_Var4._M_cur !=
                               pVar12.second.
                               super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                               ._M_cur.
                               super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                              );
                    }
                    std::
                    _Hashtable<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                    ::_M_emplace<int&,std::vector<int,std::allocator<int>>&>
                              ((_Hashtable<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                                *)&local_68,0,&local_130,&local_f8);
                    __s1 = (pointer)CONCAT44(local_f8.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                                             (int)local_f8.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start);
LAB_0020a8b1:
                    uVar9 = local_c0;
                    if (__s1 != (pointer)0x0) {
                      operator_delete(__s1,(long)local_f8.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_end_of_storage -
                                           (long)__s1);
                    }
LAB_0020a8d8:
                    lVar3 = std::__cxx11::string::find
                                      ((char)&local_90,(ulong)(uint)(int)(char)*local_e0);
                  } while (lVar3 != -1);
                }
              }
              else {
                local_118._M_dataplus._M_p = (pointer)0x0;
                local_118._M_string_length = 0;
                local_118.field_2._M_allocated_capacity = 0;
                std::
                _Hashtable<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                ::_M_emplace<int&,std::vector<int,std::allocator<int>>>
                          ((_Hashtable<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                            *)&local_68,0,&local_130,&local_118);
                if (local_118._M_dataplus._M_p != (pointer)0x0) {
                  operator_delete(local_118._M_dataplus._M_p,
                                  local_118.field_2._M_allocated_capacity -
                                  (long)local_118._M_dataplus._M_p);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_90._M_dataplus._M_p._4_4_,local_90._M_dataplus._M_p._0_4_) !=
                  &local_90.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                         local_90._M_dataplus._M_p._0_4_),
                                local_90.field_2._M_allocated_capacity + 1);
              }
              iVar8 = local_130 + 1;
              local_130 = iVar8;
              uVar2 = llama_vocab::n_tokens(local_120);
              sVar10 = local_70;
            } while (iVar8 < (int)uVar2);
          }
        }
        if (local_e0 != local_d0) {
          operator_delete(local_e0,local_d0[0] + 1);
        }
      }
      sVar10 = sVar10 + 1;
    } while (sVar10 != local_a0);
    bVar11 = true;
  }
  piVar5 = (int32_t *)operator_new(0xd8);
  *piVar5 = local_b0;
  piVar5[1] = (int32_t)local_ac;
  piVar5[2] = (int32_t)local_a8;
  piVar5[3] = local_a4;
  piVar5[4] = local_124;
  std::
  _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::_Hashtable((_Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                *)(piVar5 + 6),&local_68);
  if (bVar11) {
    local_90._M_dataplus._M_p._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)(piVar5 + 0x14),(long)local_128,
               (value_type_conflict3 *)&local_90,(allocator_type *)&local_e0);
  }
  else {
    (((vector<int,_std::allocator<int>_> *)(piVar5 + 0x14))->
    super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    piVar5[0x16] = 0;
    piVar5[0x17] = 0;
    piVar5[0x18] = 0;
    piVar5[0x19] = 0;
  }
  piVar5[0x22] = 0;
  piVar5[0x23] = 0;
  *(int32_t **)(piVar5 + 0x1a) = piVar5 + 0x26;
  piVar5[0x1c] = 1;
  piVar5[0x1d] = 0;
  piVar5[0x1e] = 0;
  piVar5[0x1f] = 0;
  piVar5[0x20] = 0;
  piVar5[0x21] = 0;
  piVar5[0x22] = 0x3f800000;
  piVar5[0x24] = 0;
  piVar5[0x25] = 0;
  piVar5[0x26] = 0;
  piVar5[0x27] = 0;
  if (bVar11) {
    *(long *)(piVar5 + 0x28) = (long)local_128;
    piVar5[0x2a] = 0;
    piVar5[0x2b] = 0;
    piVar5[0x2c] = 0;
    piVar5[0x2d] = 0;
    piVar5[0x2e] = 0;
    piVar5[0x2f] = 0;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)(piVar5 + 0x30),(long)local_128,
               (allocator_type *)&local_118);
  }
  else {
    piVar5[0x30] = 0;
    piVar5[0x31] = 0;
    piVar5[0x32] = 0;
    piVar5[0x33] = 0;
    piVar5[0x2c] = 0;
    piVar5[0x2d] = 0;
    piVar5[0x2e] = 0;
    piVar5[0x2f] = 0;
    piVar5[0x28] = 0;
    piVar5[0x29] = 0;
    piVar5[0x2a] = 0;
    piVar5[0x2b] = 0;
    piVar5[0x34] = 0;
    piVar5[0x35] = 0;
  }
  plVar6 = (llama_sampler *)operator_new(0x10);
  plVar6->iface = &llama_sampler_dry_i;
  plVar6->ctx = piVar5;
  std::
  _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::~_Hashtable(&local_68);
  return plVar6;
}

Assistant:

struct llama_sampler * llama_sampler_init_dry(const struct llama_vocab * vocab, int32_t context_size, float dry_multiplier, float dry_base, int32_t dry_allowed_length, int32_t dry_penalty_last_n, const char** seq_breakers, size_t num_breakers) {
    int32_t effective_dry_penalty_last_n = (dry_penalty_last_n == -1) ? context_size : std::max(dry_penalty_last_n, 0);
    std::unordered_multimap<llama_token, std::vector<llama_token>> processed_breakers;
    const int MAX_CHAR_LEN = 40;
    const int MAX_SEQ_LEN = 20;

    const bool dry_enabled = (dry_multiplier != 0.0f && dry_base >= 1.0f && dry_penalty_last_n != 0);

    if (dry_enabled && seq_breakers != nullptr && num_breakers > 0) {
        // Process sequence breakers
        for (size_t i = 0; i < num_breakers; ++i) {
            if (seq_breakers[i] == nullptr || std::strlen(seq_breakers[i]) == 0) {
                LLAMA_LOG_WARN("skipping null or empty DRY sequence breaker at index %zu\n", i);
                continue;
            }

            std::string sequence_break(seq_breakers[i]);
            if (sequence_break.empty()) {
                LLAMA_LOG_WARN("skipping empty DRY sequence breaker\n");
                continue;
            }

            if (sequence_break.size() > MAX_CHAR_LEN) {
                LLAMA_LOG_WARN("truncating DRY sequence breaker to %d characters\n", MAX_CHAR_LEN);
                sequence_break.resize(MAX_CHAR_LEN);
            }

            get_overlapping_token_sequences(*vocab, sequence_break, processed_breakers, MAX_SEQ_LEN);
        }
    }

    return llama_sampler_init(
        /* .iface = */ &llama_sampler_dry_i,
        /* .ctx   = */ new llama_sampler_dry {
            /* .total_context_size     = */ context_size,
            /* .dry_multiplier         = */ dry_multiplier,
            /* .dry_base               = */ dry_base,
            /* .dry_allowed_length     = */ dry_allowed_length,
            /* .dry_penalty_last_n     = */ dry_penalty_last_n,
            /* .dry_processed_breakers = */ std::move(processed_breakers),
            /* .dry_repeat_count       = */ dry_enabled ? std::vector<int>(effective_dry_penalty_last_n, 0) : std::vector<int>{},
            /* .dry_max_token_repeat   = */ {},
            /* .last_tokens            = */ dry_enabled ? ring_buffer<llama_token>(effective_dry_penalty_last_n) : ring_buffer<llama_token>(0),
        }
    );
}